

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloadsave.cpp
# Opt level: O2

void save0(char *filename)

{
  ostream *poVar1;
  Am_Value local_218;
  ofstream out_file;
  byte abStack_1e8 [480];
  
  std::ofstream::ofstream(&out_file,filename,_S_out);
  if ((abStack_1e8[*(long *)(_out_file + -0x18)] & 5) == 0) {
    Am_Load_Save_Context::Reset();
    local_218.type = 2;
    local_218.value.long_value = 5;
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)&out_file);
    Am_Value::~Am_Value(&local_218);
    local_218.type = 3;
    local_218.value.wrapper_value = (Am_Wrapper *)0x44fc16;
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)&out_file);
    Am_Value::~Am_Value(&local_218);
    local_218.type = 4;
    local_218.value.bool_value = true;
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)&out_file);
    Am_Value::~Am_Value(&local_218);
    local_218.type = 4;
    local_218.value.long_value = (ulong)(uint7)local_218.value.long_value._1_7_ << 8;
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)&out_file);
    Am_Value::~Am_Value(&local_218);
    local_218.type = 5;
    local_218.value.float_value = 54.234;
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)&out_file);
    Am_Value::~Am_Value(&local_218);
    Am_Value::Am_Value(&local_218,123.344);
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)&out_file);
    Am_Value::~Am_Value(&local_218);
    local_218.type = 7;
    local_218.value.long_value = 0x61;
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)&out_file);
    Am_Value::~Am_Value(&local_218);
    Am_Value::Am_Value(&local_218,"Hello this is a test to see what\n happens");
    Am_Load_Save_Context::Save((ostream *)&Am_Default_Load_Save_Context,(Am_Value *)&out_file);
    Am_Value::~Am_Value(&local_218);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"open failed");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::ofstream::~ofstream(&out_file);
  return;
}

Assistant:

void
save0(const char *filename)
{
  // create file for output
  std::ofstream out_file(filename, std::ios::out);
  if (!out_file) {
    std::cout << "open failed" << std::endl;
    return;
  }

  // reset internal reference counters etc. (should always be done for new stream)
  Am_Default_Load_Save_Context.Reset();

  // write some plain data objects to the stream
  Am_Default_Load_Save_Context.Save(out_file, Am_Value(5));
  Am_Default_Load_Save_Context.Save(out_file, Am_Value((long)4520982));
  Am_Default_Load_Save_Context.Save(out_file, Am_Value(true));
  Am_Default_Load_Save_Context.Save(out_file, Am_Value(false));
  Am_Default_Load_Save_Context.Save(out_file, Am_Value((float)54.234));
  Am_Default_Load_Save_Context.Save(out_file, Am_Value(123.344));
  Am_Default_Load_Save_Context.Save(out_file, Am_Value('a'));
  Am_Default_Load_Save_Context.Save(
      out_file, Am_Value("Hello this is a test to see what\n happens"));

  return;
}